

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::SubtractPropagateStatistics::Operation<long,duckdb::TrySubtractOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  Value local_70;
  
  lVar1 = NumericStats::GetMin<long>(lstats);
  lVar2 = NumericStats::GetMax<long>(rstats);
  bVar5 = true;
  if (!SBORROW8(lVar1,lVar2)) {
    lVar3 = NumericStats::GetMax<long>(lstats);
    lVar4 = NumericStats::GetMin<long>(rstats);
    if (!SBORROW8(lVar3,lVar4)) {
      Value::Numeric(&local_70,type,lVar1 - lVar2);
      Value::operator=(new_min,&local_70);
      Value::~Value(&local_70);
      Value::Numeric(&local_70,type,lVar3 - lVar4);
      Value::operator=(new_max,&local_70);
      Value::~Value(&local_70);
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(rstats), min)) {
			return true;
		}
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMin<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}